

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dioextra.c
# Opt level: O0

void check_keen_vision(CHAR_DATA *ch,CHAR_DATA *victim)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  CHAR_DATA *in_RSI;
  CHAR_DATA *in_RDI;
  int chance;
  CHAR_DATA *gch;
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffedd0;
  undefined4 in_stack_ffffffffffffedd8;
  CHAR_DATA *victim_00;
  CHAR_DATA *in_stack_ffffffffffffede8;
  int in_stack_ffffffffffffeea4;
  undefined1 in_stack_ffffffffffffeeab;
  int in_stack_ffffffffffffeeac;
  CHAR_DATA *in_stack_ffffffffffffeeb0;
  int in_stack_ffffffffffffeecc;
  CHAR_DATA *in_stack_ffffffffffffeed0;
  
  for (victim_00 = in_RDI->in_room->people; victim_00 != (CHAR_DATA *)0x0;
      victim_00 = victim_00->next_in_room) {
    if ((((victim_00 != in_RDI) && (victim_00 != in_RSI)) &&
        (bVar1 = can_see(in_stack_ffffffffffffede8,victim_00), bVar1)) &&
       ((iVar2 = get_skill(in_stack_ffffffffffffeed0,in_stack_ffffffffffffeecc), iVar2 != 0 &&
        (iVar3 = number_percent(), iVar3 < iVar2)))) {
      in_stack_ffffffffffffedd0 =
           (CHAR_DATA *)
           pers((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffedd8),in_stack_ffffffffffffedd0);
      pcVar4 = pers((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffedd8),in_stack_ffffffffffffedd0
                   );
      sprintf(&stack0xffffffffffffede8,"You notice %s slipping into %s\'s inventory.\n\r",
              in_stack_ffffffffffffedd0,pcVar4);
      send_to_char((char *)victim_00,(CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffedd8));
      check_improve(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
                    (bool)in_stack_ffffffffffffeeab,in_stack_ffffffffffffeea4);
    }
  }
  return;
}

Assistant:

void check_keen_vision(CHAR_DATA *ch, CHAR_DATA *victim)
{
	char buf[MAX_STRING_LENGTH];
	CHAR_DATA *gch;
	int chance;

	for (gch = ch->in_room->people; gch != nullptr; gch = gch->next_in_room)
	{
		if (gch == ch || gch == victim)
			continue;

		if (!can_see(gch, ch))
			continue;

		chance = get_skill(gch, gsn_keen_vision);
		if (chance == 0)
			continue;

		if (number_percent() < chance)
		{
			sprintf(buf, "You notice %s slipping into %s's inventory.\n\r", pers(ch, gch), pers(victim, gch));
			send_to_char(buf, gch);
			check_improve(gch, gsn_keen_vision, true, 1);
		}
	}
}